

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idle.c
# Opt level: O1

int run_test_idle_starvation(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_timer_t *puVar2;
  undefined8 uVar3;
  uv_idle_t *puVar4;
  uv_check_t *puVar5;
  
  puVar2 = (uv_timer_t *)uv_default_loop();
  iVar1 = uv_idle_init(puVar2,&idle_handle);
  if (iVar1 == 0) {
    puVar4 = &idle_handle;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    puVar2 = (uv_timer_t *)puVar4;
    if (iVar1 != 0) goto LAB_0015cfec;
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_check_init(puVar2,&check_handle);
    if (iVar1 != 0) goto LAB_0015cff1;
    puVar5 = &check_handle;
    iVar1 = uv_check_start(&check_handle,check_cb);
    puVar2 = (uv_timer_t *)puVar5;
    if (iVar1 != 0) goto LAB_0015cff6;
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    if (iVar1 != 0) goto LAB_0015cffb;
    puVar2 = &timer_handle;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 != 0) goto LAB_0015d000;
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_run(puVar2,0);
    if (iVar1 != 0) goto LAB_0015d005;
    if (idle_cb_called < 1) goto LAB_0015d00a;
    if (timer_cb_called != 1) goto LAB_0015d00f;
    if (close_cb_called == 3) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar2 = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015d019;
    }
  }
  else {
    run_test_idle_starvation_cold_1();
LAB_0015cfec:
    run_test_idle_starvation_cold_2();
LAB_0015cff1:
    run_test_idle_starvation_cold_3();
LAB_0015cff6:
    run_test_idle_starvation_cold_4();
LAB_0015cffb:
    run_test_idle_starvation_cold_5();
LAB_0015d000:
    run_test_idle_starvation_cold_6();
LAB_0015d005:
    run_test_idle_starvation_cold_7();
LAB_0015d00a:
    run_test_idle_starvation_cold_8();
LAB_0015d00f:
    run_test_idle_starvation_cold_9();
  }
  run_test_idle_starvation_cold_10();
LAB_0015d019:
  run_test_idle_starvation_cold_11();
  if (puVar2 == (uv_timer_t *)&idle_handle) {
    idle_cb_cold_2();
    return extraout_EAX;
  }
  idle_cb_cold_1();
  if (puVar2 == (uv_timer_t *)&check_handle) {
    check_cb_cold_2();
    return extraout_EAX_00;
  }
  check_cb_cold_1();
  if (puVar2 == &timer_handle) {
    timer_cb_cold_2();
    return extraout_EAX_01;
  }
  timer_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(idle_starvation) {
  int r;

  r = uv_idle_init(uv_default_loop(), &idle_handle);
  ASSERT(r == 0);
  r = uv_idle_start(&idle_handle, idle_cb);
  ASSERT(r == 0);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT(r == 0);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT(r == 0);

  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT(r == 0);
  r = uv_timer_start(&timer_handle, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(idle_cb_called > 0);
  ASSERT(timer_cb_called == 1);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}